

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Pointer MA_get_mbase(Integer datatype)

{
  Pointer pcVar1;
  
  ma_stats.calls[6] = ma_stats.calls[6] + 1;
  ma_preinitialize("MA_get_mbase");
  if (datatype - 1000U < 0x11) {
    pcVar1 = *(Pointer *)(datatype * 8 + 0x1e4120);
  }
  else {
    pcVar1 = (Pointer)0x0;
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
    ma_error(EL_Fatal,ET_External,"MA_get_mbase",ma_ebuf);
  }
  return pcVar1;
}

Assistant:

public Pointer MA_get_mbase(Integer datatype)    /* to get base address of */
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_mbase]++;
#endif /* STATS */

    /* preinitialize if necessary */
    ma_preinitialize("MA_get_mbase");

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_get_mbase", ma_ebuf);
        return NULL;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    return ma_base[datatype];
}